

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O0

uint16_t * icu_63::getGroup(UCharNames *names,uint32_t code)

{
  ushort uVar1;
  ushort *puVar2;
  ushort local_26;
  ushort local_24;
  uint16_t number;
  uint16_t limit;
  uint16_t start;
  uint16_t groupMSB;
  uint16_t *groups;
  uint32_t code_local;
  UCharNames *names_local;
  
  puVar2 = (ushort *)((long)&names->tokenStringOffset + (ulong)names->groupsOffset);
  local_24 = 0;
  local_26 = *puVar2;
  uVar1 = local_24;
  while (local_24 = uVar1, (int)(uint)local_24 < (int)(local_26 - 1)) {
    uVar1 = (ushort)((ulong)((uint)local_24 + (uint)local_26) / 2);
    if ((code >> 5 & 0xffff) < (uint)puVar2[(long)(int)((uint)uVar1 * 3) + 1]) {
      local_26 = uVar1;
      uVar1 = local_24;
    }
  }
  return puVar2 + (long)(int)((uint)local_24 * 3) + 1;
}

Assistant:

static const uint16_t *
getGroup(UCharNames *names, uint32_t code) {
    const uint16_t *groups=GET_GROUPS(names);
    uint16_t groupMSB=(uint16_t)(code>>GROUP_SHIFT),
             start=0,
             limit=*groups++,
             number;

    /* binary search for the group of names that contains the one for code */
    while(start<limit-1) {
        number=(uint16_t)((start+limit)/2);
        if(groupMSB<groups[number*GROUP_LENGTH+GROUP_MSB]) {
            limit=number;
        } else {
            start=number;
        }
    }

    /* return this regardless of whether it is an exact match */
    return groups+start*GROUP_LENGTH;
}